

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::adaptive_bit_model>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  adaptive_bit_model *local_38;
  adaptive_bit_model *pDst;
  adaptive_bit_model *pSrc_end;
  adaptive_bit_model *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (adaptive_bit_model *)pDst_void;
  for (pSrc_end = (adaptive_bit_model *)pSrc_void;
      pSrc_end != (adaptive_bit_model *)((long)pSrc_void + (ulong)num * 2); pSrc_end = pSrc_end + 1)
  {
    adaptive_bit_model::adaptive_bit_model(local_38,pSrc_end);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }